

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getsockname.c
# Opt level: O2

void on_connection(uv_stream_t *server,int status)

{
  int iVar1;
  char *pcVar2;
  undefined8 uVar3;
  int64_t eval_b;
  int64_t eval_a;
  
  eval_a = (int64_t)status;
  if (eval_a == 0) {
    iVar1 = uv_tcp_init(server->loop,&connection);
    eval_a = (int64_t)iVar1;
    if (eval_a == 0) {
      iVar1 = uv_accept(server,(uv_stream_t *)&connection);
      eval_a = (int64_t)iVar1;
      if (eval_a == 0) {
        iVar1 = uv_read_start((uv_stream_t *)&connection,on_alloc,on_read1);
        eval_a = (int64_t)iVar1;
        if (eval_a == 0) {
          return;
        }
        pcVar2 = "uv_read_start((uv_stream_t*)&connection, on_alloc, on_read1)";
        uVar3 = 0x5f;
      }
      else {
        pcVar2 = "uv_accept(server, (uv_stream_t* )&connection)";
        uVar3 = 0x5d;
      }
    }
    else {
      pcVar2 = "uv_tcp_init(server->loop, &connection)";
      uVar3 = 0x5b;
    }
  }
  else {
    pcVar2 = "status";
    uVar3 = 0x59;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-read-stop-start.c"
          ,uVar3,pcVar2,"==","0",eval_a,"==",0);
  abort();
}

Assistant:

static void on_connection(uv_stream_t* server, int status) {
  struct sockaddr sockname, peername;
  int namelen;
  uv_tcp_t* handle;
  int r;

  if (status != 0) {
    fprintf(stderr, "Connect error %s\n", uv_err_name(status));
  }
  ASSERT_OK(status);

  handle = malloc(sizeof(*handle));
  ASSERT_NOT_NULL(handle);

  r = uv_tcp_init(loop, handle);
  ASSERT_OK(r);

  /* associate server with stream */
  handle->data = server;

  r = uv_accept(server, (uv_stream_t*)handle);
  ASSERT_OK(r);

  namelen = sizeof sockname;
  r = uv_tcp_getsockname(handle, &sockname, &namelen);
  ASSERT_OK(r);
  check_sockname(&sockname, "127.0.0.1", server_port, "accepted socket");
  getsocknamecount_tcp++;

  namelen = sizeof peername;
  r = uv_tcp_getpeername(handle, &peername, &namelen);
  ASSERT_OK(r);
  check_sockname(&peername, "127.0.0.1", connect_port, "accepted socket peer");
  getpeernamecount++;

  r = uv_read_start((uv_stream_t*)handle, alloc, after_read);
  ASSERT_OK(r);
}